

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddNgonFilled(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments)

{
  int in_ECX;
  uint in_EDX;
  undefined8 in_RDI;
  ImU32 col_00;
  float fVar1;
  float a_max;
  
  col_00 = (ImU32)((ulong)in_RDI >> 0x20);
  if (((in_EDX & 0xff000000) != 0) && (2 < in_ECX)) {
    fVar1 = (((float)in_ECX - 1.0) * 6.2831855) / (float)in_ECX;
    PathArcTo(this,center,radius,(float)col,(float)num_segments,(int)a_max);
    PathFillConvex((ImDrawList *)CONCAT44(in_ECX,fVar1),col_00);
  }
  return;
}

Assistant:

void ImDrawList::AddNgonFilled(const ImVec2& center, float radius, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || num_segments <= 2)
        return;

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(center, radius, 0.0f, a_max, num_segments - 1);
    PathFillConvex(col);
}